

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall
AccountingTestMemoryAllocator::free_memory
          (AccountingTestMemoryAllocator *this,char *memory,size_t param_2,char *file,size_t line)

{
  size_t size_00;
  size_t size;
  size_t line_local;
  char *file_local;
  size_t param_2_local;
  char *memory_local;
  AccountingTestMemoryAllocator *this_local;
  
  size_00 = removeMemoryFromTrackingAndReturnAllocatedSize(this,memory);
  MemoryAccountant::dealloc(this->accountant_,size_00);
  (*this->originalAllocator_->_vptr_TestMemoryAllocator[3])
            (this->originalAllocator_,memory,size_00,file,line);
  return;
}

Assistant:

void AccountingTestMemoryAllocator::free_memory(char* memory, size_t, const char* file, size_t line)
{
    size_t size = removeMemoryFromTrackingAndReturnAllocatedSize(memory);
    accountant_.dealloc(size);
    originalAllocator_->free_memory(memory, size, file, line);
}